

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O0

int AF_A_SpawnBishop(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  AActor *other;
  bool bVar1;
  bool local_76;
  bool local_73;
  DVector3 local_70;
  FName local_54;
  AActor *local_50;
  AActor *mo;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_18;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_18 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                  ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_73 = true;
    if (stateowner != (AActor *)0x0) {
      local_73 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_73 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                    ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, pVStack_18[(int)self].field_0.field_1.atag != 1)) {
        bVar1 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                      ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_18[(int)self].field_0.field_1.a;
      local_76 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_76 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_76 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                      ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_18[(int)self].field_0.field_3.Type != 0xff)) {
      bVar1 = false;
      if ((pVStack_18[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar1 = true, pVStack_18[(int)self].field_0.field_1.atag != 8)) {
        bVar1 = pVStack_18[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar1) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                      ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      mo = (AActor *)pVStack_18[(int)self].field_0.field_1.a;
    }
    else {
      mo = (AActor *)0x0;
    }
    FName::FName(&local_54,"Bishop");
    AActor::Pos(&local_70,stateowner);
    local_50 = Spawn(&local_54,&local_70,ALLOW_REPLACE);
    if (local_50 != (AActor *)0x0) {
      bVar1 = P_TestMobjLocation(local_50);
      if (bVar1) {
        bVar1 = TObjPtr<AActor>::operator!=(&stateowner->target,(AActor *)0x0);
        this = local_50;
        if (bVar1) {
          other = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
          AActor::CopyFriendliness(this,other,true,true);
          (local_50->master).field_0 = (stateowner->target).field_0;
        }
      }
      else {
        AActor::ClearCounters(local_50);
        (*(local_50->super_DThinker).super_DObject._vptr_DObject[4])();
      }
    }
    (*(stateowner->super_DThinker).super_DObject._vptr_DObject[4])();
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0x352,"int AF_A_SpawnBishop(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SpawnBishop)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	mo = Spawn("Bishop", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		if (!P_TestMobjLocation(mo))
		{
			mo->ClearCounters();
			mo->Destroy ();
		}
		else if (self->target != NULL)
		{ // [RH] Make the new bishops inherit the Heriarch's target
			mo->CopyFriendliness (self->target, true);
			mo->master = self->target;
		}
	}
	self->Destroy ();
	return 0;
}